

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimples.cpp
# Opt level: O0

double pce(Mat *input)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  _InputArray *p_Var4;
  double dVar5;
  _InputArray local_200;
  Point_<int> local_1e8;
  Point minLoc;
  Point maxLoc;
  double minValue;
  double maxValue;
  Mat roi;
  undefined1 local_168 [8];
  Rect r;
  int i;
  int j;
  Mat local_148 [8];
  Mat res_pce;
  int cols;
  int rows;
  Mat T;
  Mat local_70 [8];
  Mat T_;
  Mat *input_local;
  
  cv::Mat::Mat(local_70,8,8,6);
  pdVar3 = cv::Mat::at<double>(local_70,0,0);
  *pdVar3 = 1.0;
  iVar2 = cv::Mat::type(local_70);
  cv::Mat::Mat((Mat *)&cols,8,8,iVar2);
  zero_mean(local_70,(Mat *)&cols);
  iVar2 = *(int *)(input + 8);
  iVar1 = *(int *)(input + 0xc);
  cv::Size_<int>::Size_((Size_<int> *)&i,iVar2 + -8,iVar1 + -8);
  cv::Mat::Mat(local_148,&i,6);
  for (r.height = 0; r.height < iVar1 + -8; r.height = r.height + 1) {
    for (r.width = 0; r.width < iVar2 + -8; r.width = r.width + 1) {
      cv::Rect_<int>::Rect_((Rect_<int> *)local_168,r.height,r.width,8,8);
      cv::Mat::operator()((Mat *)&maxValue,(Rect *)input);
      dVar5 = multiplyAdd((Mat *)&maxValue,(Mat *)&cols);
      pdVar3 = cv::Mat::at<double>(local_148,r.width,r.height);
      *pdVar3 = dVar5;
      cv::Mat::~Mat((Mat *)&maxValue);
    }
  }
  cv::Point_<int>::Point_(&minLoc);
  cv::Point_<int>::Point_(&local_1e8);
  cv::_InputArray::_InputArray(&local_200,local_148);
  p_Var4 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_200,(double *)&maxLoc,&minValue,(Point_ *)&local_1e8,(Point_ *)&minLoc,p_Var4
               );
  cv::_InputArray::~_InputArray(&local_200);
  cv::Mat::~Mat(local_148);
  cv::Mat::~Mat((Mat *)&cols);
  cv::Mat::~Mat(local_70);
  return minValue;
}

Assistant:

double pce(const Mat &input)
{
    //设置8*8的模板
    Mat T_ = Mat(8, 8, CV_64FC1);
    T_.at<double>(0,0) = 1.0;
    Mat T=Mat(8, 8, T_.type());
    zero_mean(T_,T);
//    cout<<T<<endl;
    
    int rows = input.rows;
    int cols = input.cols;
    Mat res_pce = Mat(Size(rows-8,cols-8),CV_64FC1);
    
    for(int j = 0;j<cols-8;j++)
    {
        for(int i = 0;i<rows-8;i++)
        {
            Rect r= Rect(j,i,8,8);
            Mat roi = input(r);
            res_pce.at<double>(i,j)=multiplyAdd(roi,T);
        }
    }
    //找到所有PCE值里面最大的
    double maxValue,minValue;
    Point maxLoc,minLoc;
    minMaxLoc(res_pce,&minValue,&maxValue, &minLoc, &maxLoc);
    return maxValue;
}